

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t value;
  size_t slotIndex;
  anon_struct_16_2_bdb3c092 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.tuple = 0;
  gcFrame.value = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  local_40 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_58);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.tuple =
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  value = sysbvm_interpreter_evaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
  gcFrame.value = value;
  slotIndex = sysbvm_typeSlot_getIndex(*(sysbvm_tuple_t *)(*arguments + 0x40));
  sysbvm_tuple_slotAtPut(context,gcFrame.tuple,slotIndex,value);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_58);
  return gcFrame.value;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtPutNode_t **node = (sysbvm_astTupleSlotNamedAtPutNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->valueExpression, *environment);
    size_t slotIndex = sysbvm_typeSlot_getIndex((*node)->boundSlot);
    sysbvm_tuple_slotAtPut(context, gcFrame.tuple, slotIndex, gcFrame.value);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.value;
}